

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseMemidx(WastParser *this,Location loc,Var *out_memidx)

{
  bool bVar1;
  Result RVar2;
  Var local_70;
  
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    if ((this->options_->features).multi_memory_enabled_ == false) {
LAB_00191eb0:
      Error(this,0x1f71a0);
      return (Result)Error;
    }
    RVar2 = Expect(this,Lpar);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = Expect(this,Memory);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = ParseVar(this,out_memidx);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
  }
  else {
    Var::Var(&local_70,0,&loc);
    bVar1 = ParseVarOpt(this,out_memidx,&local_70);
    if (bVar1) {
      bVar1 = (this->options_->features).multi_memory_enabled_;
      Var::~Var(&local_70);
      if (bVar1 == false) goto LAB_00191eb0;
    }
    else {
      Var::~Var(&local_70);
    }
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseMemidx(Location loc, Var* out_memidx) {
  WABT_TRACE(ParseMemidx);
  if (PeekMatchLpar(TokenType::Memory)) {
    if (!options_->features.multi_memory_enabled()) {
      Error(loc, "Specifying memory variable is not allowed");
      return Result::Error;
    }
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(out_memidx));
    EXPECT(Rpar);
  } else {
    if (ParseVarOpt(out_memidx, Var(0, loc)) &&
        !options_->features.multi_memory_enabled()) {
      Error(loc, "Specifying memory variable is not allowed");
      return Result::Error;
    }
  }
  return Result::Ok;
}